

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  allocator<char> local_61;
  double local_60;
  char buffer [36];
  char formatString [15];
  
  local_60 = value;
  snprintf(formatString,0xf,"%%.%dg",CONCAT71(in_register_00000011,useSpecialFloats) & 0xffffffff);
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    pcVar4 = buffer;
    iVar1 = snprintf(pcVar4,0x24,formatString,local_60);
    for (; pcVar4 < buffer + iVar1; pcVar4 = pcVar4 + 1) {
      if (*pcVar4 == ',') {
        *pcVar4 = '.';
      }
    }
    pcVar4 = strchr(buffer,0x2e);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strchr(buffer,0x65);
      if (pcVar4 == (char *)0x0) {
        sVar3 = strlen(buffer);
        (buffer + sVar3)[0] = '.';
        (buffer + sVar3)[1] = '0';
        buffer[sVar3 + 2] = '\0';
      }
    }
  }
  else {
    if (NAN(local_60)) {
      pcVar2 = "NaN";
      pcVar4 = "null";
    }
    else if (0.0 <= local_60) {
      pcVar2 = "Infinity";
      pcVar4 = "1e+9999";
    }
    else {
      pcVar2 = "-Infinity";
      pcVar4 = "-1e+9999";
    }
    if ((char)this != '\0') {
      pcVar4 = pcVar2;
    }
    iVar1 = snprintf(buffer,0x24,pcVar4);
  }
  if (-1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,buffer,&local_61);
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0xcc,
                "std::string Json::(anonymous namespace)::valueToString(double, bool, unsigned int)"
               );
}

Assistant:

JSONCPP_STRING valueToString(double value, bool useSpecialFloats, unsigned int precision) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[36];
  int len = -1;

  char formatString[15];
  snprintf(formatString, sizeof(formatString), "%%.%dg", precision);

  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distingish the
  // concepts of reals and integers.
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), formatString, value);
    fixNumericLocale(buffer, buffer + len);

    // try to ensure we preserve the fact that this was given to us as a double on input
    if (!strchr(buffer, '.') && !strchr(buffer, 'e')) {
      strcat(buffer, ".0");
    }

  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "NaN" : "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "-Infinity" : "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "Infinity" : "1e+9999");
    }
  }
  assert(len >= 0);
  return buffer;
}